

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O3

BOOL __thiscall
Js::TypedArrayBase::SetWritable(TypedArrayBase *this,PropertyId propertyId,BOOL value)

{
  ScriptContext *this_00;
  BOOL BVar1;
  PropertyRecord *pPVar2;
  uint32 local_2c [2];
  uint32 index;
  
  this_00 = (((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  BVar1 = ScriptContext::IsNumericPropertyId(this_00,propertyId,local_2c);
  if (BVar1 == 0) {
    BVar1 = DynamicObject::SetWritable((DynamicObject *)this,propertyId,value);
  }
  else {
    BVar1 = 1;
    if (value == 0) {
      pPVar2 = ThreadContext::GetPropertyName(this_00->threadContext,propertyId);
      JavascriptError::ThrowTypeError(this_00,-0x7ff5ec2a,(PCWSTR)(pPVar2 + 1));
    }
  }
  return BVar1;
}

Assistant:

BOOL TypedArrayBase::SetWritable(PropertyId propertyId, BOOL value)
    {
        ScriptContext* scriptContext = GetScriptContext();
        uint32 index;

        // default is writable
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            if (!value)
            {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_DefineProperty_NotConfigurable,
                scriptContext->GetThreadContext()->GetPropertyName(propertyId)->GetBuffer());
            }
            return true;
        }

        return __super::SetWritable(propertyId, value);
    }